

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O0

void createVars(vec<vec<IntVar_*>_> *x,int n,int m,int min,int max,bool el)

{
  vec<IntVar_*> *pvVar1;
  IntVar **ppIVar2;
  int in_EDX;
  int in_ESI;
  vec<vec<IntVar_*>_> *in_RDI;
  undefined1 in_R9B;
  int j;
  int i;
  uint in_stack_ffffffffffffffcc;
  IntVar *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  uint index;
  undefined3 in_stack_ffffffffffffffe4;
  uint min_00;
  
  min_00 = CONCAT13(in_R9B,in_stack_ffffffffffffffe4) & 0x1ffffff;
  vec<vec<IntVar_*>_>::growTo
            ((vec<vec<IntVar_*>_> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  for (index = 0; (int)index < in_ESI; index = index + 1) {
    vec<vec<IntVar_*>_>::operator[](in_RDI,index);
    vec<IntVar_*>::growTo((vec<IntVar_*> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    for (local_24 = 0; (int)local_24 < in_EDX; local_24 = local_24 + 1) {
      in_stack_ffffffffffffffd0 = newIntVar(min_00,index);
      pvVar1 = vec<vec<IntVar_*>_>::operator[](in_RDI,index);
      ppIVar2 = vec<IntVar_*>::operator[](pvVar1,local_24);
      *ppIVar2 = in_stack_ffffffffffffffd0;
      if ((min_00 & 0x1000000) != 0) {
        pvVar1 = vec<vec<IntVar_*>_>::operator[](in_RDI,index);
        vec<IntVar_*>::operator[](pvVar1,local_24);
        IntVar::specialiseToEL((IntVar *)CONCAT44(min_00,index));
      }
    }
  }
  return;
}

Assistant:

void createVars(vec<vec<IntVar*> >& x, int n, int m, int min, int max, bool el) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i].growTo(m);
		for (int j = 0; j < m; j++) {
			x[i][j] = newIntVar(min, max);
			if (el) {
				x[i][j]->specialiseToEL();
			}
		}
	}
}